

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::val::anon_unknown_0::getStructMembers
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t struct_id,Op type,ValidationState_t *vstate)

{
  Instruction *pIVar1;
  undefined4 in_register_00000014;
  pointer puVar2;
  uint id;
  uint32_t local_44;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,struct_id,
                   (ValidationState_t *)CONCAT44(in_register_00000014,type));
  for (puVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      puVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_44 = *puVar2;
    pIVar1 = ValidationState_t::FindDef
                       ((ValidationState_t *)CONCAT44(in_register_00000014,type),local_44);
    if ((pIVar1->inst_).opcode == 0x1e) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_44);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> getStructMembers(uint32_t struct_id, spv::Op type,
                                       ValidationState_t& vstate) {
  std::vector<uint32_t> members;
  for (auto id : getStructMembers(struct_id, vstate)) {
    if (type == vstate.FindDef(id)->opcode()) {
      members.push_back(id);
    }
  }
  return members;
}